

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_format_tar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  undefined8 *__ptr;
  int64_t iVar2;
  void *pvVar3;
  bool bVar4;
  sparse_block *p;
  tar *tar;
  ssize_t bytes_read;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  bytes_read = (ssize_t)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  while( true ) {
    while( true ) {
      bVar4 = false;
      if (*(long *)((long)pvVar1 + 0x138) != 0) {
        bVar4 = *(long *)(*(long *)((long)pvVar1 + 0x138) + 0x10) == 0;
      }
      if (!bVar4) break;
      __ptr = *(undefined8 **)((long)pvVar1 + 0x138);
      *(undefined8 *)((long)pvVar1 + 0x138) = *__ptr;
      free(__ptr);
    }
    if (*(long *)((long)pvVar1 + 0x128) != 0) {
      __archive_read_consume((archive_read *)buff_local,*(int64_t *)((long)pvVar1 + 0x128));
      *(undefined8 *)((long)pvVar1 + 0x128) = 0;
    }
    if ((*(long *)((long)pvVar1 + 0x138) == 0) || (*(long *)((long)pvVar1 + 0x110) == 0)) {
      iVar2 = __archive_read_consume((archive_read *)buff_local,*(int64_t *)((long)pvVar1 + 0x120));
      if (iVar2 < 0) {
        return L'\xffffffe2';
      }
      *(undefined8 *)((long)pvVar1 + 0x120) = 0;
      *size_local = 0;
      *offset_local = 0;
      *(undefined8 *)bytes_read = *(undefined8 *)((long)pvVar1 + 0x130);
      return L'\x01';
    }
    pvVar3 = __archive_read_ahead((archive_read *)buff_local,1,(ssize_t *)&tar);
    *size_local = (size_t)pvVar3;
    if ((long)tar < 0) {
      return L'\xffffffe2';
    }
    if (*size_local == 0) break;
    if (*(long *)((long)pvVar1 + 0x110) < (long)tar) {
      tar = *(tar **)((long)pvVar1 + 0x110);
    }
    if (*(long *)(*(long *)((long)pvVar1 + 0x138) + 0x10) < (long)tar) {
      tar = *(tar **)(*(long *)((long)pvVar1 + 0x138) + 0x10);
    }
    *offset_local = (int64_t)tar;
    *(undefined8 *)bytes_read = *(undefined8 *)(*(long *)((long)pvVar1 + 0x138) + 8);
    *(long *)(*(long *)((long)pvVar1 + 0x138) + 0x10) =
         *(long *)(*(long *)((long)pvVar1 + 0x138) + 0x10) - (long)tar;
    *(long *)(*(long *)((long)pvVar1 + 0x138) + 8) =
         (long)&(tar->acl_text).s + *(long *)(*(long *)((long)pvVar1 + 0x138) + 8);
    *(long *)((long)pvVar1 + 0x110) = *(long *)((long)pvVar1 + 0x110) - (long)tar;
    *(tar **)((long)pvVar1 + 0x128) = tar;
    if (*(int *)(*(long *)((long)pvVar1 + 0x138) + 0x18) == 0) {
      return L'\0';
    }
  }
  archive_set_error((archive *)buff_local,-1,"Truncated tar archive");
  return L'\xffffffe2';
}

Assistant:

static int
archive_read_format_tar_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct tar *tar;
	struct sparse_block *p;

	tar = (struct tar *)(a->format->data);

	for (;;) {
		/* Remove exhausted entries from sparse list. */
		while (tar->sparse_list != NULL &&
		    tar->sparse_list->remaining == 0) {
			p = tar->sparse_list;
			tar->sparse_list = p->next;
			free(p);
		}

		if (tar->entry_bytes_unconsumed) {
			__archive_read_consume(a, tar->entry_bytes_unconsumed);
			tar->entry_bytes_unconsumed = 0;
		}

		/* If we're at end of file, return EOF. */
		if (tar->sparse_list == NULL ||
		    tar->entry_bytes_remaining == 0) {
			if (__archive_read_consume(a, tar->entry_padding) < 0)
				return (ARCHIVE_FATAL);
			tar->entry_padding = 0;
			*buff = NULL;
			*size = 0;
			*offset = tar->realsize;
			return (ARCHIVE_EOF);
		}

		*buff = __archive_read_ahead(a, 1, &bytes_read);
		if (bytes_read < 0)
			return (ARCHIVE_FATAL);
		if (*buff == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated tar archive");
			return (ARCHIVE_FATAL);
		}
		if (bytes_read > tar->entry_bytes_remaining)
			bytes_read = (ssize_t)tar->entry_bytes_remaining;
		/* Don't read more than is available in the
		 * current sparse block. */
		if (tar->sparse_list->remaining < bytes_read)
			bytes_read = (ssize_t)tar->sparse_list->remaining;
		*size = bytes_read;
		*offset = tar->sparse_list->offset;
		tar->sparse_list->remaining -= bytes_read;
		tar->sparse_list->offset += bytes_read;
		tar->entry_bytes_remaining -= bytes_read;
		tar->entry_bytes_unconsumed = bytes_read;

		if (!tar->sparse_list->hole)
			return (ARCHIVE_OK);
		/* Current is hole data and skip this. */
	}
}